

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O1

CrispyValue std_list(CrispyValue *value,Vm *vm)

{
  Object *pOVar1;
  size_t size;
  long lVar2;
  ulong uVar3;
  ObjString *object;
  ObjString *object_00;
  uint uVar4;
  ulong uVar5;
  ObjString *string;
  CrispyValue CVar6;
  
  if (value->type == OBJECT) {
    pOVar1 = (value->field_1).o_value;
    if (pOVar1->type == OBJ_STRING) {
      size._0_1_ = pOVar1[1].marked;
      size._1_3_ = *(undefined3 *)&pOVar1[1].field_0x1;
      size._4_4_ = pOVar1[1].type;
      object = (ObjString *)new_list(vm,size);
      lVar2._0_1_ = pOVar1[1].marked;
      lVar2._1_3_ = *(undefined3 *)&pOVar1[1].field_0x1;
      lVar2._4_4_ = pOVar1[1].type;
      if (lVar2 != 0) {
        uVar4 = 1;
        uVar5 = 0;
        do {
          lVar2 = *(long *)&object->hashed;
          object_00 = new_string(vm,(char *)(&(pOVar1[1].next)->marked + uVar5),1);
          CVar6 = create_object(&object_00->object);
          *(ValueType *)(lVar2 + uVar5 * 0x10) = CVar6.type;
          ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(lVar2 + 8 + uVar5 * 0x10))->p_value =
               (uint64_t)CVar6.field_1;
          uVar5 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
          uVar3._0_1_ = pOVar1[1].marked;
          uVar3._1_3_ = *(undefined3 *)&pOVar1[1].field_0x1;
          uVar3._4_4_ = pOVar1[1].type;
        } while (uVar5 < uVar3);
      }
      goto LAB_00108789;
    }
    if (pOVar1->type == OBJ_LIST) {
      CVar6.field_1.p_value = (value->field_1).p_value;
      CVar6._0_8_ = 2;
      return CVar6;
    }
  }
  vm->err_flag = true;
  object = new_string(vm,"Invalid type for list()",0x17);
LAB_00108789:
  CVar6 = create_object(&object->object);
  return CVar6;
}

Assistant:

CrispyValue std_list(CrispyValue *value, Vm *vm) {
    switch (value[0].type) {
        case OBJECT:
            switch (value->o_value->type) {
                case OBJ_LIST:
                    return *value;
                case OBJ_STRING: {
                    ObjString *string = (ObjString *) value->o_value;
                    ObjList *list = new_list(vm, string->length);

                    for (uint32_t i = 0; i < string->length; ++i) {
                        list->content.values[i] =
                                create_object((Object *) new_string(vm, string->start + i, 1));
                    }

                    return create_object((Object *) list);
                }
                default:
                    vm->err_flag = true;
                    return create_object((Object *) new_string(vm, "Invalid type for list()", 23));
            }
        default:
            vm->err_flag = true;
            return create_object((Object *) new_string(vm, "Invalid type for list()", 23));
    }
}